

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

double * getDWTmra(wt_object wt,double *wavecoeffs)

{
  int level;
  double *reccoeff;
  double *mra;
  int N;
  int access;
  int J;
  int i;
  double *wavecoeffs_local;
  wt_object wt_local;
  
  level = wt->J;
  reccoeff = (double *)malloc((long)wt->siglength * 8 * (long)(level + 1));
  mra._4_4_ = 0;
  getDWTRecCoeff(wt->output,wt->length,"appx",wt->ext,level,level,wt->wave->lpr,wt->wave->hpr,
                 wt->wave->lpr_len,wt->siglength,reccoeff);
  mra._0_4_ = wt->siglength;
  for (access = level; 0 < access; access = access + -1) {
    mra._4_4_ = wt->length[level - access] + mra._4_4_;
    getDWTRecCoeff(wt->output + mra._4_4_,wt->length,"det",wt->ext,access,level,wt->wave->lpr,
                   wt->wave->hpr,wt->wave->lpr_len,wt->siglength,reccoeff + (int)mra);
    mra._0_4_ = wt->siglength + (int)mra;
  }
  return reccoeff;
}

Assistant:

double *getDWTmra(wt_object wt, double *wavecoeffs) {
	int i, J, access,N;
	double *mra;
	J = wt->J;
	mra = (double*)malloc(sizeof(double)* wt->siglength*(J + 1));
	access = 0;
	

	// Approximation MRA
	getDWTRecCoeff(wt->output + access, wt->length, "appx", wt->ext, J, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra);

	// Details MRA
	N = wt->siglength;
	for (i = J; i > 0; --i) {
		access += wt->length[J - i];
		getDWTRecCoeff(wt->output + access, wt->length, "det", wt->ext, i, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra+N);
		N += wt->siglength;
	}
	
	return mra;
}